

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xgemm.c
# Opt level: O3

void xb_cgemm(char *transa,char *transb,int *M,int *N,int *K,void *alpha,void *a,int *p_lda,void *b,
             int *p_ldb,void *beta,void *c,int *p_ldc)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  float *pfVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  float *pfVar10;
  int iVar11;
  float *pfVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  float *pfVar17;
  ulong uVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  ulong local_60;
  
  iVar1 = *M;
  iVar2 = *N;
  iVar8 = *K;
  if (iVar1 <= *p_ldc && (0 < iVar8 && (0 < iVar2 && 0 < iVar1))) {
    uVar3 = *p_lda;
    uVar4 = *p_ldb;
    iVar5 = iVar8;
    if ((byte)(*transa | 0x20U) == 0x6e) {
      iVar5 = iVar1;
    }
    if (iVar5 <= (int)uVar3) {
      iVar5 = iVar2;
      if ((byte)(*transb | 0x20U) == 0x6e) {
        iVar5 = iVar8;
      }
      if (iVar5 <= (int)uVar4) {
        fVar19 = *alpha;
        if (((((fVar19 != 0.0) || (NAN(fVar19))) || (*(float *)((long)alpha + 4) != 0.0)) ||
            ((NAN(*(float *)((long)alpha + 4)) || (*beta != 1.0)))) ||
           ((NAN(*beta) ||
            ((*(float *)((long)beta + 4) != 0.0 || (NAN(*(float *)((long)beta + 4)))))))) {
          if ((byte)(*transa | 0x20U) == 0x6e) {
            lVar13 = (ulong)uVar3 * 2;
            local_60 = 2;
          }
          else {
            local_60 = (ulong)(uVar3 * 2);
            lVar13 = 2;
          }
          if ((byte)(*transb | 0x20U) == 0x6e) {
            lVar14 = (ulong)uVar4 * 2;
            uVar18 = 2;
          }
          else {
            uVar18 = (ulong)(uVar4 * 2);
            lVar14 = 2;
          }
          iVar5 = *p_ldc * 2;
          if ((((fVar19 != 0.0) || (NAN(fVar19))) || (*(float *)((long)alpha + 4) != 0.0)) ||
             (NAN(*(float *)((long)alpha + 4)))) {
            if (((fVar19 != 1.0) || (NAN(fVar19))) ||
               ((*(float *)((long)alpha + 4) != 0.0 || (NAN(*(float *)((long)alpha + 4)))))) {
              pfVar12 = (float *)((long)a + 4);
              lVar16 = 0;
              iVar7 = 0;
              do {
                iVar11 = 0;
                lVar15 = lVar16;
                pfVar10 = (float *)((long)b + 4);
                do {
                  fVar19 = 0.0;
                  fVar20 = 0.0;
                  pfVar6 = pfVar10;
                  pfVar17 = pfVar12;
                  iVar9 = iVar8;
                  do {
                    fVar21 = *pfVar17;
                    if ((byte)(*transa | 0x20U) == 99) {
                      fVar21 = -fVar21;
                    }
                    fVar22 = *pfVar6;
                    if ((byte)(*transb | 0x20U) == 99) {
                      fVar22 = -fVar22;
                    }
                    fVar19 = fVar19 + fVar22 * pfVar17[-1] + fVar21 * pfVar6[-1];
                    fVar20 = fVar20 + pfVar6[-1] * pfVar17[-1] + -fVar21 * fVar22;
                    pfVar6 = pfVar6 + uVar18;
                    pfVar17 = pfVar17 + lVar13;
                    iVar9 = iVar9 + -1;
                  } while (iVar9 != 0);
                  fVar21 = *(float *)((long)c + lVar15 * 4);
                  fVar22 = *(float *)((long)c + lVar15 * 4 + 4);
                  fVar25 = (float)*alpha;
                  fVar26 = (float)((ulong)*alpha >> 0x20);
                  fVar23 = (float)*beta;
                  fVar24 = (float)((ulong)*beta >> 0x20);
                  *(ulong *)((long)c + lVar15 * 4) =
                       CONCAT44(fVar21 * fVar24 + fVar23 * fVar22 +
                                fVar20 * fVar26 + fVar25 * fVar19,
                                fVar21 * fVar23 + fVar24 * -fVar22 +
                                fVar20 * fVar25 + fVar26 * -fVar19);
                  iVar11 = iVar11 + 1;
                  lVar15 = lVar15 + iVar5;
                  pfVar10 = pfVar10 + lVar14;
                } while (iVar11 != iVar2);
                iVar7 = iVar7 + 1;
                lVar16 = lVar16 + 2;
                pfVar12 = pfVar12 + local_60;
              } while (iVar7 != iVar1);
            }
            else if (((*beta != 0.0) || (NAN(*beta))) ||
                    ((*(float *)((long)beta + 4) != 0.0 || (NAN(*(float *)((long)beta + 4)))))) {
              pfVar12 = (float *)((long)a + 4);
              lVar16 = 0;
              iVar7 = 0;
              do {
                iVar11 = 0;
                pfVar10 = (float *)((long)b + 4);
                lVar15 = lVar16;
                do {
                  fVar19 = 0.0;
                  fVar20 = 0.0;
                  pfVar6 = pfVar10;
                  pfVar17 = pfVar12;
                  iVar9 = iVar8;
                  do {
                    fVar21 = *pfVar17;
                    if ((byte)(*transa | 0x20U) == 99) {
                      fVar21 = -fVar21;
                    }
                    fVar22 = *pfVar6;
                    if ((byte)(*transb | 0x20U) == 99) {
                      fVar22 = -fVar22;
                    }
                    fVar19 = fVar19 + pfVar6[-1] * pfVar17[-1] + -fVar21 * fVar22;
                    fVar20 = fVar20 + fVar22 * pfVar17[-1] + fVar21 * pfVar6[-1];
                    pfVar6 = pfVar6 + uVar18;
                    pfVar17 = pfVar17 + lVar13;
                    iVar9 = iVar9 + -1;
                  } while (iVar9 != 0);
                  fVar21 = *(float *)((long)c + lVar15 * 4);
                  fVar22 = *(float *)((long)c + lVar15 * 4 + 4);
                  fVar23 = (float)*beta;
                  fVar24 = (float)((ulong)*beta >> 0x20);
                  *(ulong *)((long)c + lVar15 * 4) =
                       CONCAT44(fVar20 + fVar21 * fVar24 + fVar23 * fVar22,
                                fVar19 + fVar21 * fVar23 + fVar24 * -fVar22);
                  iVar11 = iVar11 + 1;
                  lVar15 = lVar15 + iVar5;
                  pfVar10 = pfVar10 + lVar14;
                } while (iVar11 != iVar2);
                iVar7 = iVar7 + 1;
                lVar16 = lVar16 + 2;
                pfVar12 = pfVar12 + local_60;
              } while (iVar7 != iVar1);
            }
            else {
              pfVar12 = (float *)((long)a + 4);
              lVar16 = 0;
              iVar7 = 0;
              do {
                iVar11 = 0;
                pfVar10 = (float *)((long)b + 4);
                lVar15 = lVar16;
                do {
                  fVar19 = 0.0;
                  fVar20 = 0.0;
                  pfVar6 = pfVar12;
                  pfVar17 = pfVar10;
                  iVar9 = iVar8;
                  do {
                    fVar21 = *pfVar6;
                    if ((byte)(*transa | 0x20U) == 99) {
                      fVar21 = -fVar21;
                    }
                    fVar22 = *pfVar17;
                    if ((byte)(*transb | 0x20U) == 99) {
                      fVar22 = -fVar22;
                    }
                    fVar19 = fVar19 + pfVar17[-1] * pfVar6[-1] + -fVar21 * fVar22;
                    fVar20 = fVar20 + fVar22 * pfVar6[-1] + fVar21 * pfVar17[-1];
                    pfVar17 = pfVar17 + uVar18;
                    pfVar6 = pfVar6 + lVar13;
                    iVar9 = iVar9 + -1;
                  } while (iVar9 != 0);
                  *(ulong *)((long)c + lVar15 * 4) = CONCAT44(fVar20,fVar19);
                  iVar11 = iVar11 + 1;
                  lVar15 = lVar15 + iVar5;
                  pfVar10 = pfVar10 + lVar14;
                } while (iVar11 != iVar2);
                iVar7 = iVar7 + 1;
                lVar16 = lVar16 + 2;
                pfVar12 = pfVar12 + local_60;
              } while (iVar7 != iVar1);
            }
          }
          else {
            iVar7 = 0;
            iVar8 = iVar2;
            pfVar12 = (float *)c;
            do {
              do {
                fVar19 = (float)*beta;
                fVar20 = (float)((ulong)*beta >> 0x20);
                *(ulong *)c = CONCAT44(*c * fVar20 + fVar19 * *(float *)((long)c + 4),
                                       *c * fVar19 + fVar20 * -*(float *)((long)c + 4));
                c = (void *)((long)c + (long)iVar5 * 4);
                iVar8 = iVar8 + -1;
              } while (iVar8 != 0);
              iVar7 = iVar7 + 1;
              c = pfVar12 + 2;
              iVar8 = iVar2;
              pfVar12 = (float *)c;
            } while (iVar7 != iVar1);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void
xb_cgemm (char * transa, char *transb, int *M, int *N, int *K,
	  const void *alpha, const void *a, int *p_lda, const void *b, 
	  int *p_ldb, const void *beta, void *c, int *p_ldc)
/* 
 * Purpose
 * =======
 *
 * This routine computes the matrix product:
 *
 *      C   <-  alpha * op(A) * op(B)  +  beta * C .
 * 
 * where op(M) represents either M, M transpose, 
 * or M conjugate transpose.
 *
 * Arguments
 * =========
 *
 * order   (input) enum blas_order_type
 *         Storage  of input matrices A, B, and C.
 *
 * transa  (input) enum blas_trans_type
 *         Operation to be done on matrix A before multiplication.
 *         Can be no operation, transposition, or conjugate transposition.
 *
 * transb  (input) enum blas_trans_type
 *         Operation to be done on matrix B before multiplication.
 *         Can be no operation, transposition, or conjugate transposition.
 * 
 * m n k   (input) int
 *         The dimensions of matrices A, B, and C.
 *         Matrix C is m-by-n matrix.
 *         Matrix A is m-by-k if A is not transposed, 
 *                     k-by-m otherwise.
 *         Matrix B is k-by-n if B is not transposed, 
 *                     n-by-k otherwise.
 *      
 * alpha   (input) const void*
 *
 * a       (input) const void*
 *         matrix A.
 * 
 * lda     (input) int
 *         leading dimension of A.
 * 
 * b       (input) const void*
 *         matrix B
 *
 * ldb     (input) int
 *         leading dimension of B.
 *
 * beta    (input) const void*
 *
 * c       (input/output) void*
 *         matrix C
 *
 * ldc     (input) int
 *         leading dimension of C.
 *
 */
{


    /* Integer Index Variables */
    int i, j, h;

    int ai, bj, ci;
    int aih, bhj, cij;		/* Index into matrices a, b, c during multiply */

    int incai, incaih;		/* Index increments for matrix a */
    int incbj, incbhj;		/* Index increments for matrix b */
    int incci, inccij;		/* Index increments for matrix c */

    /* Input Matrices */
    const float *a_i = (float *) a;
    const float *b_i = (float *) b;

    /* Output Matrix */
    float *c_i = (float *) c;

    /* Input Scalars */
    float *alpha_i = (float *) alpha;
    float *beta_i = (float *) beta;
    int m=*M, n=*N, k=*K;
    int lda=*p_lda, ldb=*p_ldb, ldc=*p_ldc;

    /* Temporary Floating-Point Variables */
    float a_elem[2];
    float b_elem[2];
    float c_elem[2];
    float prod[2];
    float sum[2];
    float tmp1[2];
    float tmp2[2];

    char order = COLMAJOR; /* For the time being, it is always COLMAJOR.
			      Eventually, it might change. */

#if MDEBUG
    printf("In Zgemm\n");
#endif

    /* Test for error conditions */
    if (m <= 0 || n <= 0 || k <= 0)
    {
	return;
    }

    if (order == COLMAJOR)
    {

	if (ldc < m)
	    return;

	if (*transa == 'n' || *transa == 'N')
	{
	    if (lda < m)
		return;
	}
	else
	{
	    if (lda < k)
		return;
	}

	if (*transb == 'n' || *transb == 'N')
	{
	    if (ldb < k)
		return;
	}
	else
	{
	    if (ldb < n)
		return;
	}

    }
    else
    {
	/* row major */
	if (ldc < n)
	    return;

	if (*transa == 'n' || *transa == 'N')
	{
	    if (lda < k)
		return;
	}
	else
	{
	    if (lda < m)
		return;
	}

	if (*transb == 'n' || *transb == 'N')
	{
	    if (ldb < n)
		return;
	}
	else
	{
	    if (ldb < k)
		return;
	}
    }

    /* Test for no-op */
    if (alpha_i[0] == 0.0 && alpha_i[1] == 0.0
	&& (beta_i[0] == 1.0 && beta_i[1] == 0.0))
    {
	return;
    }

    /* Set Index Parameters */
    if (order == COLMAJOR)
    {
	incci = 1;
	inccij = ldc;

	if (*transa == 'n' || *transa == 'N')
	{
	    incai = 1;
	    incaih = lda;
	}
	else
	{
	    incai = lda;
	    incaih = 1;
	}

	if (*transb == 'n' || *transb == 'N')
	{
	    incbj = ldb;
	    incbhj = 1;
	}
	else
	{
	    incbj = 1;
	    incbhj = ldb;
	}

    }
    else
    {
	/* row major */
	incci = ldc;
	inccij = 1;

	if (*transa == 'n' || *transa == 'N')
	{
	    incai = lda;
	    incaih = 1;
	}
	else
	{
	    incai = 1;
	    incaih = lda;
	}

	if (*transb == 'n' || *transb == 'N')
	{
	    incbj = 1;
	    incbhj = ldb;
	}
	else
	{
	    incbj = ldb;
	    incbhj = 1;
	}

    }



    /* Ajustment to increments */
    incci *= 2;
    inccij *= 2;
    incai *= 2;
    incaih *= 2;
    incbj *= 2;
    incbhj *= 2;

    /* alpha = 0.  In this case, just return beta * C */
    if (alpha_i[0] == 0.0 && alpha_i[1] == 0.0)
    {

	ci = 0;
	for (i = 0; i < m; i++, ci += incci)
	{
	    cij = ci;
	    for (j = 0; j < n; j++, cij += inccij)
	    {
		c_elem[0] = c_i[cij];
		c_elem[1] = c_i[cij + 1];
		{
		    tmp1[0] =
			(float) c_elem[0] * beta_i[0] -
			(float) c_elem[1] * beta_i[1];
		    tmp1[1] =
			(float) c_elem[0] * beta_i[1] +
			(float) c_elem[1] * beta_i[0];
		}
		c_i[cij] = tmp1[0];
		c_i[cij + 1] = tmp1[1];
	    }
	}

    }
    else if ((alpha_i[0] == 1.0 && alpha_i[1] == 0.0))
    {

	/* Case alpha == 1. */

	if (beta_i[0] == 0.0 && beta_i[1] == 0.0)
	{
	    /* Case alpha == 1, beta == 0.   We compute  C <--- A * B */

	    ci = 0;
	    ai = 0;
	    for (i = 0; i < m; i++, ci += incci, ai += incai)
	    {

		cij = ci;
		bj = 0;

		for (j = 0; j < n; j++, cij += inccij, bj += incbj)
		{

		    aih = ai;
		    bhj = bj;

		    sum[0] = sum[1] = 0.0;

		    for (h = 0; h < k; h++, aih += incaih, bhj += incbhj)
		    {
			a_elem[0] = a_i[aih];
			a_elem[1] = a_i[aih + 1];
			b_elem[0] = b_i[bhj];
			b_elem[1] = b_i[bhj + 1];
			if (*transa == 'c' || *transa == 'C')
			{
			  a_elem[1] = -a_elem[1];
			}
			if (*transb == 'c' || *transb == 'C')
			{
			    b_elem[1] = -b_elem[1];
			}
			
			{
			    prod[0] =
				(float) a_elem[0] * b_elem[0] -
				(float) a_elem[1] * b_elem[1];
			    prod[1] =
				(float) a_elem[0] * b_elem[1] +
				(float) a_elem[1] * b_elem[0];
			}
			sum[0] = sum[0] + prod[0];
			sum[1] = sum[1] + prod[1];
		    }
		    tmp1[0] = sum[0];
		    tmp1[1] = sum[1];
		    c_i[cij] = tmp1[0];
		    c_i[cij + 1] = tmp1[1];
		}
	    }

	}
	else
	{
	    /* Case alpha == 1, but beta != 0.
	       We compute   C <--- A * B + beta * C   */

	    ci = 0;
	    ai = 0;
	    for (i = 0; i < m; i++, ci += incci, ai += incai)
	    {

		cij = ci;
		bj = 0;

		for (j = 0; j < n; j++, cij += inccij, bj += incbj)
		{

		    aih = ai;
		    bhj = bj;

		    sum[0] = sum[1] = 0.0;

		    for (h = 0; h < k; h++, aih += incaih, bhj += incbhj)
		    {
			a_elem[0] = a_i[aih];
			a_elem[1] = a_i[aih + 1];
			b_elem[0] = b_i[bhj];
			b_elem[1] = b_i[bhj + 1];
			if (*transa == 'c' || *transa == 'C')
			{
			    a_elem[1] = -a_elem[1];
			}
			if (*transb == 'c' || *transb == 'C')
			{
			    b_elem[1] = -b_elem[1];
			}
			{
			    prod[0] =
				(float) a_elem[0] * b_elem[0] -
				(float) a_elem[1] * b_elem[1];
			    prod[1] =
				(float) a_elem[0] * b_elem[1] +
				(float) a_elem[1] * b_elem[0];
			}
			sum[0] = sum[0] + prod[0];
			sum[1] = sum[1] + prod[1];
		    }

		    c_elem[0] = c_i[cij];
		    c_elem[1] = c_i[cij + 1];
		    {
			tmp2[0] =
			    (float) c_elem[0] * beta_i[0] -
			    (float) c_elem[1] * beta_i[1];
			tmp2[1] =
			    (float) c_elem[0] * beta_i[1] +
			    (float) c_elem[1] * beta_i[0];
		    }
		    tmp1[0] = sum[0];
		    tmp1[1] = sum[1];
		    tmp1[0] = tmp2[0] + tmp1[0];
		    tmp1[1] = tmp2[1] + tmp1[1];
		    c_i[cij] = tmp1[0];
		    c_i[cij + 1] = tmp1[1];
		}
	    }
	}

    }
    else
    {

	/* The most general form,   C <-- alpha * A * B + beta * C  */
	ci = 0;
	ai = 0;
	for (i = 0; i < m; i++, ci += incci, ai += incai)
	{

	    cij = ci;
	    bj = 0;

	    for (j = 0; j < n; j++, cij += inccij, bj += incbj)
	    {

		aih = ai;
		bhj = bj;

		sum[0] = sum[1] = 0.0;

		for (h = 0; h < k; h++, aih += incaih, bhj += incbhj)
		{
		    a_elem[0] = a_i[aih];
		    a_elem[1] = a_i[aih + 1];
		    b_elem[0] = b_i[bhj];
		    b_elem[1] = b_i[bhj + 1];
		    if (*transa == 'c' || *transa == 'C')
		    {
			a_elem[1] = -a_elem[1];
		    }
		    if (*transb == 'c' || *transb == 'C')
		    {
			b_elem[1] = -b_elem[1];
		    }
		    {
			prod[0] =
			    (float) a_elem[0] * b_elem[0] -
			    (float) a_elem[1] * b_elem[1];
			prod[1] =
			    (float) a_elem[0] * b_elem[1] +
			    (float) a_elem[1] * b_elem[0];
		    }
		    sum[0] = sum[0] + prod[0];
		    sum[1] = sum[1] + prod[1];
		}

		{
		    tmp1[0] =
			(float) sum[0] * alpha_i[0] -
			(float) sum[1] * alpha_i[1];
		    tmp1[1] =
			(float) sum[0] * alpha_i[1] +
			(float) sum[1] * alpha_i[0];
		}
		c_elem[0] = c_i[cij];
		c_elem[1] = c_i[cij + 1];
		{
		    tmp2[0] =
			(float) c_elem[0] * beta_i[0] -
			(float) c_elem[1] * beta_i[1];
		    tmp2[1] =
			(float) c_elem[0] * beta_i[1] +
			(float) c_elem[1] * beta_i[0];
		}
		tmp1[0] = tmp1[0] + tmp2[0];
		tmp1[1] = tmp1[1] + tmp2[1];
		c_i[cij] = tmp1[0];
		c_i[cij + 1] = tmp1[1];
	    }
	}

    }



}